

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O2

QBitArray *
performBitwiseOperationHelper<std::bit_and<unsigned_char>>(QBitArray *out,long a1,long a2)

{
  char *pcVar1;
  long lVar2;
  QByteArrayData *d2;
  QByteArrayData *d1;
  long lVar3;
  long lVar4;
  long lVar5;
  qsizetype i;
  long lVar6;
  
  lVar5 = *(long *)(a1 + 8);
  lVar6 = *(long *)(a1 + 0x10);
  lVar3 = *(long *)(a2 + 0x10);
  lVar2 = lVar6;
  lVar4 = *(long *)(a2 + 8);
  if (lVar6 < lVar3) {
    lVar2 = lVar3;
    lVar3 = lVar6;
    lVar4 = lVar5;
    lVar5 = *(long *)(a2 + 8);
  }
  pcVar1 = (out->d).d.ptr;
  for (lVar6 = 1; lVar6 < lVar3; lVar6 = lVar6 + 1) {
    pcVar1[lVar6] = *(byte *)(lVar4 + lVar6) & *(byte *)(lVar5 + lVar6);
  }
  lVar5 = 1;
  if (1 < lVar3) {
    lVar5 = lVar3;
  }
  for (; lVar5 < lVar2; lVar5 = lVar5 + 1) {
    pcVar1[lVar5] = '\0';
  }
  return out;
}

Assistant:

Q_NEVER_INLINE static
QBitArray &performBitwiseOperationHelper(QBitArray &out, const QBitArray &a1,
                                         const QBitArray &a2, BitwiseOp op)
{
    const QByteArrayData &d1 = a1.data_ptr();
    const QByteArrayData &d2 = a2.data_ptr();

    // Sizes in bytes (including the initial bit difference counter)
    qsizetype n1 = d1.size;
    qsizetype n2 = d2.size;
    Q_ASSERT(out.data_ptr().size == qMax(n1, n2));
    Q_ASSERT(out.data_ptr().size == 0 || !out.data_ptr().needsDetach());

    // Bypass QByteArray's emptiness verification; we won't dereference
    // these pointers if their size is zero.
    auto dst = reinterpret_cast<uchar *>(out.data_ptr().data());
    auto p1 = reinterpret_cast<const uchar *>(d1.data());
    auto p2 = reinterpret_cast<const uchar *>(d2.data());

    // Main: perform the operation in the range where both arrays have data
    if (n1 < n2) {
        std::swap(n1, n2);
        std::swap(p1, p2);
    }
    for (qsizetype i = 1; i < n2; ++i)
        dst[i] = op(p1[i], p2[i]);

    // Tail: operate as if both arrays had the same data by padding zeroes to
    // the end of the shorter of the two (for std::bit_or and std::bit_xor, this is
    // a memmove; for std::bit_and, it's memset to 0).
    for (qsizetype i = qMax(n2, qsizetype(1)); i < n1; ++i)
        dst[i] = op(p1[i], uchar(0));

    return out;
}